

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int ParseExpCmp(char **p,aint *nval)

{
  int iVar1;
  int iVar2;
  int local_28;
  int oper;
  aint right;
  aint left;
  aint *nval_local;
  char **p_local;
  
  _right = nval;
  nval_local = (aint *)p;
  iVar1 = ParseExpMinMax(p,&oper);
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    while (iVar1 = need((char **)nval_local,"<=>=< > "), iVar1 != 0) {
      iVar2 = ParseExpMinMax((char **)nval_local,&local_28);
      if (iVar2 == 0) {
        return 0;
      }
      if (iVar1 == 0x3c) {
        oper = -(uint)(oper < local_28);
      }
      else if (iVar1 == 0x3e) {
        oper = -(uint)(local_28 < oper);
      }
      else if (iVar1 == 0x79) {
        oper = -(uint)(oper <= local_28);
      }
      else if (iVar1 == 0x7b) {
        oper = -(uint)(local_28 <= oper);
      }
      else {
        Error("internal error",(char *)0x0,FATAL);
      }
    }
    *_right = oper;
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

static int ParseExpCmp(char*& p, aint& nval) {
	aint left, right;
	int oper;
	if (!ParseExpMinMax(p, left)) return 0;
	while ((oper = need(p, "<=>=< > "))) {
		if (!ParseExpMinMax(p, right)) return 0;
		switch (oper) {
		case '<':
			left = -(left < right); break;
		case '>':
			left = -(left > right); break;
		case '<'+'=':
			left = -(left <= right); break;
		case '>'+'=':
			left = -(left >= right); break;
		default: Error("internal error", nullptr, FATAL); break;	// unreachable
		}
	}
	nval = left;
	return 1;
}